

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::PushItemFlag(ImGuiItemFlags option,bool enabled)

{
  ImGuiItemFlags *pIVar1;
  int *piVar2;
  ImVector<int> *pIVar3;
  int iVar4;
  ImGuiWindow *pIVar5;
  int *piVar6;
  ImGuiContext *pIVar7;
  ImGuiContext *ctx;
  int *__dest;
  int iVar8;
  int iVar9;
  undefined7 in_register_00000031;
  
  pIVar7 = GImGui;
  pIVar5 = GImGui->CurrentWindow;
  pIVar5->WriteAccessed = true;
  if ((int)CONCAT71(in_register_00000031,enabled) == 0) {
    pIVar1 = &(pIVar5->DC).ItemFlags;
    *pIVar1 = *pIVar1 & ~option;
  }
  else {
    pIVar1 = &(pIVar5->DC).ItemFlags;
    *pIVar1 = *pIVar1 | option;
  }
  iVar9 = (pIVar5->DC).ItemFlagsStack.Size;
  iVar4 = (pIVar5->DC).ItemFlagsStack.Capacity;
  if (iVar9 == iVar4) {
    iVar9 = iVar9 + 1;
    if (iVar4 == 0) {
      iVar8 = 8;
    }
    else {
      iVar8 = iVar4 / 2 + iVar4;
    }
    if (iVar9 < iVar8) {
      iVar9 = iVar8;
    }
    if (iVar4 < iVar9) {
      if (pIVar7 != (ImGuiContext *)0x0) {
        piVar6 = &(pIVar7->IO).MetricsActiveAllocations;
        *piVar6 = *piVar6 + 1;
      }
      __dest = (int *)(*GImAllocatorAllocFunc)((long)iVar9 << 2,GImAllocatorUserData);
      piVar6 = (pIVar5->DC).ItemFlagsStack.Data;
      if (piVar6 != (int *)0x0) {
        memcpy(__dest,piVar6,(long)(pIVar5->DC).ItemFlagsStack.Size << 2);
        piVar6 = (pIVar5->DC).ItemFlagsStack.Data;
        if ((piVar6 != (int *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar2 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar2 = *piVar2 + -1;
        }
        (*GImAllocatorFreeFunc)(piVar6,GImAllocatorUserData);
      }
      (pIVar5->DC).ItemFlagsStack.Data = __dest;
      (pIVar5->DC).ItemFlagsStack.Capacity = iVar9;
    }
  }
  (pIVar5->DC).ItemFlagsStack.Data[(pIVar5->DC).ItemFlagsStack.Size] = (pIVar5->DC).ItemFlags;
  pIVar3 = &(pIVar5->DC).ItemFlagsStack;
  pIVar3->Size = pIVar3->Size + 1;
  return;
}

Assistant:

int ImTextStrFromUtf8(ImWchar* buf, int buf_size, const char* in_text, const char* in_text_end, const char** in_text_remaining)
{
    ImWchar* buf_out = buf;
    ImWchar* buf_end = buf + buf_size;
    while (buf_out < buf_end-1 && (!in_text_end || in_text < in_text_end) && *in_text)
    {
        unsigned int c;
        in_text += ImTextCharFromUtf8(&c, in_text, in_text_end);
        if (c == 0)
            break;
        if (c < 0x10000)    // FIXME: Losing characters that don't fit in 2 bytes
            *buf_out++ = (ImWchar)c;
    }
    *buf_out = 0;
    if (in_text_remaining)
        *in_text_remaining = in_text;
    return (int)(buf_out - buf);
}